

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

CharPtr __thiscall
fmt::BasicWriter<char>::
prepare_int_buffer<fmt::IntFormatSpec<unsigned_int,fmt::AlignTypeSpec<(char)0>,char>>
          (BasicWriter<char> *this,uint num_digits,
          IntFormatSpec<unsigned_int,_fmt::AlignTypeSpec<__x00_>,_char> *spec,char *prefix,
          uint prefix_size)

{
  byte bVar1;
  uint uVar2;
  Alignment AVar3;
  Buffer<char> *pBVar4;
  Type TVar5;
  CharPtr pcVar6;
  CharPtr pcVar7;
  char __tmp;
  size_t __len_2;
  ulong __n;
  size_t __len;
  ulong uVar8;
  ptrdiff_t _Num;
  uint uVar9;
  AlignSpec subspec;
  
  uVar2 = (spec->super_AlignTypeSpec<__x00_>).super_AlignSpec.super_WidthSpec.width_;
  uVar8 = (ulong)uVar2;
  AVar3 = (spec->super_AlignTypeSpec<__x00_>).super_AlignSpec.align_;
  bVar1 = (byte)(spec->super_AlignTypeSpec<__x00_>).super_AlignSpec.super_WidthSpec.fill_;
  if ((int)num_digits < -1) {
    if (prefix_size == 0) {
      prefix_size = 0;
    }
    else if (prefix[prefix_size - 1] == '0') {
      prefix_size = prefix_size - 1;
    }
    TVar5 = internal::to_unsigned<int>(-1);
    uVar9 = TVar5 + prefix_size;
    subspec.super_WidthSpec.fill_ = L'0';
    subspec.align_ = ALIGN_NUMERIC;
    subspec.super_WidthSpec.width_ = uVar9;
    if (uVar2 <= uVar9) {
      pcVar6 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&subspec,prefix,prefix_size);
      return pcVar6;
    }
    pBVar4 = this->buffer_;
    if (pBVar4->capacity_ < uVar8) {
      (**pBVar4->_vptr_Buffer)(pBVar4,uVar8);
    }
    uVar8 = (ulong)(uVar2 - uVar9);
    if (AVar3 != ALIGN_LEFT) {
      pcVar6 = grow_buffer(this,uVar8);
      memset(pcVar6,(uint)bVar1,uVar8);
    }
    pcVar6 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&subspec,prefix,prefix_size);
    if (AVar3 != ALIGN_LEFT) {
      return pcVar6;
    }
    pcVar7 = grow_buffer(this,uVar8);
    memset(pcVar7,(uint)bVar1,uVar8);
    return pcVar6;
  }
  uVar9 = prefix_size + num_digits;
  if (uVar2 <= uVar9) {
    pcVar6 = grow_buffer(this,(ulong)uVar9);
    if (prefix_size != 0) {
      memmove(pcVar6,prefix,(ulong)prefix_size);
    }
    pcVar6 = pcVar6 + uVar9;
    goto LAB_0016754b;
  }
  pcVar7 = grow_buffer(this,uVar8);
  pcVar6 = pcVar7 + uVar8;
  if (AVar3 == ALIGN_NUMERIC) {
    if (prefix_size != 0) {
      memmove(pcVar7,prefix,(ulong)prefix_size);
      pcVar7 = pcVar7 + prefix_size;
      uVar9 = num_digits;
    }
  }
  else {
    if (AVar3 == ALIGN_CENTER) {
      uVar8 = uVar8 - uVar9;
      __n = uVar8 >> 1;
      if (1 < uVar8) {
        memset(pcVar7,(uint)bVar1,__n);
      }
      pcVar6 = pcVar7 + __n + uVar9;
      memset(pcVar6,(uint)bVar1,uVar8 - __n);
      if (prefix_size != 0) {
        memmove(pcVar7 + __n,prefix,(ulong)prefix_size);
      }
      goto LAB_0016754b;
    }
    if (AVar3 == ALIGN_LEFT) {
      if (prefix_size != 0) {
        memmove(pcVar7,prefix,(ulong)prefix_size);
      }
      pcVar6 = pcVar7 + uVar9;
      memset(pcVar6,(uint)bVar1,uVar8 - uVar9);
      goto LAB_0016754b;
    }
    if (prefix_size != 0) {
      memmove(pcVar6 + -(ulong)uVar9,prefix,(ulong)prefix_size);
    }
  }
  if (pcVar6 + (-(long)pcVar7 - (ulong)uVar9) != (CharPtr)0x0) {
    memset(pcVar7,(uint)bVar1,(size_t)(pcVar6 + (-(long)pcVar7 - (ulong)uVar9)));
  }
LAB_0016754b:
  return pcVar6 + -1;
}

Assistant:

typename BasicWriter<Char>::CharPtr BasicWriter<Char>::prepare_int_buffer(
    unsigned num_digits, const Spec &spec, const char *prefix, unsigned prefix_size)
{
    unsigned width = spec.width();
    Alignment align = spec.align();
    Char fill = internal::CharTraits<Char>::cast(spec.fill());
    if (spec.precision() > static_cast<int>(num_digits))
    {
        // Octal prefix '0' is counted as a digit, so ignore it if precision
        // is specified.
        if (prefix_size > 0 && prefix[prefix_size - 1] == '0')
            --prefix_size;
        unsigned number_size = prefix_size + internal::to_unsigned(spec.precision());
        AlignSpec subspec(number_size, '0', ALIGN_NUMERIC);
        if (number_size >= width)
            return prepare_int_buffer(num_digits, subspec, prefix, prefix_size);
        buffer_.reserve(width);
        unsigned fill_size = width - number_size;
        if (align != ALIGN_LEFT)
        {
            CharPtr p = grow_buffer(fill_size);
            std::uninitialized_fill(p, p + fill_size, fill);
        }
        CharPtr result = prepare_int_buffer(num_digits, subspec, prefix, prefix_size);
        if (align == ALIGN_LEFT)
        {
            CharPtr p = grow_buffer(fill_size);
            std::uninitialized_fill(p, p + fill_size, fill);
        }
        return result;
    }
    unsigned size = prefix_size + num_digits;
    if (width <= size)
    {
        CharPtr p = grow_buffer(size);
        std::uninitialized_copy(prefix, prefix + prefix_size, p);
        return p + size - 1;
    }
    CharPtr p = grow_buffer(width);
    CharPtr end = p + width;
    if (align == ALIGN_LEFT)
    {
        std::uninitialized_copy(prefix, prefix + prefix_size, p);
        p += size;
        std::uninitialized_fill(p, end, fill);
    }
    else if (align == ALIGN_CENTER)
    {
        p = fill_padding(p, width, size, fill);
        std::uninitialized_copy(prefix, prefix + prefix_size, p);
        p += size;
    }
    else
    {
        if (align == ALIGN_NUMERIC)
        {
            if (prefix_size != 0)
            {
                p = std::uninitialized_copy(prefix, prefix + prefix_size, p);
                size -= prefix_size;
            }
        }
        else
        {
            std::uninitialized_copy(prefix, prefix + prefix_size, end - size);
        }
        std::uninitialized_fill(p, end - size, fill);
        p = end;
    }
    return p - 1;
}